

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall Epoll::epoll_del(Epoll *this,int fd,int event)

{
  int iVar1;
  iterator iVar2;
  int fd_local;
  epoll_event ev;
  
  fd_local = fd;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->ep_event_map)._M_h,&fd_local);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur !=
      (__node_type *)0x0) {
    ev.events = ~event & *(uint *)((long)iVar2.
                                         super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>
                                         ._M_cur + 0x10);
    *(uint32_t *)
     ((long)iVar2.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur +
     0x10) = ev.events;
    if (ev.events == 0) {
      epoll_del(this,fd_local);
    }
    else {
      ev.data.fd = fd_local;
      iVar1 = epoll_ctl(this->ep_epoll_fd,3,fd_local,(epoll_event *)&ev);
      if ((iVar1 == -1) && (-1 < pr_level)) {
        printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_del",0x47,
               (ulong)(uint)fd_local);
      }
    }
  }
  return;
}

Assistant:

void Epoll::epoll_del(int fd, int event) {

    ep_event_map_iter ret;
    if (ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        return ;
    }

    int &target_event = ret->second.event;

    if (target_event = target_event & (~event); target_event == 0) {
        this->epoll_del(fd);
    }
    else {
        struct epoll_event ev;
        ev.events = target_event;
        ev.data.fd = fd;
        if (epoll_ctl(ep_epoll_fd, EPOLL_CTL_MOD, fd, &ev) == -1) {
            PR_ERROR("epoll ctl error for fd %d\n", fd);
            return;
        }
    }
}